

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  GetterYs<int> *pGVar11;
  TransformerLinLog *pTVar12;
  ImPlotPlot *pIVar13;
  GetterYRef *pGVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  double dVar17;
  double dVar18;
  ImVec2 IVar19;
  ushort uVar20;
  ImPlotContext *pIVar21;
  ImPlotContext *pIVar22;
  bool bVar23;
  ImDrawIdx IVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  ImVec2 IVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  
  pIVar21 = GImPlot;
  pGVar11 = this->Getter1;
  pTVar12 = this->Transformer;
  dVar17 = (double)(prim + 1);
  dVar7 = pGVar11->XScale;
  dVar8 = pGVar11->X0;
  iVar10 = pGVar11->Count;
  dVar18 = log10((double)*(int *)((long)pGVar11->Ys +
                                 (long)(((prim + 1 + pGVar11->Offset) % iVar10 + iVar10) % iVar10) *
                                 (long)pGVar11->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar12->YAxis].Range.Min);
  pIVar22 = GImPlot;
  iVar10 = pTVar12->YAxis;
  pIVar13 = pIVar21->CurrentPlot;
  dVar9 = pIVar13->YAxis[iVar10].Range.Min;
  fVar27 = (float)(((dVar7 * dVar17 + dVar8) - (pIVar13->XAxis).Range.Min) * pIVar21->Mx +
                  (double)pIVar21->PixelRange[iVar10].Min.x);
  fVar26 = (float)((((double)(float)(dVar18 / pIVar21->LogDenY[iVar10]) *
                     (pIVar13->YAxis[iVar10].Range.Max - dVar9) + dVar9) - dVar9) *
                   pIVar21->My[iVar10] + (double)pIVar21->PixelRange[iVar10].Min.y);
  pGVar14 = this->Getter2;
  dVar7 = pGVar14->XScale;
  dVar8 = pGVar14->X0;
  pTVar12 = this->Transformer;
  dVar18 = log10(pGVar14->YRef / GImPlot->CurrentPlot->YAxis[pTVar12->YAxis].Range.Min);
  iVar10 = pTVar12->YAxis;
  pIVar13 = pIVar22->CurrentPlot;
  dVar9 = pIVar13->YAxis[iVar10].Range.Min;
  fVar31 = (float)(((dVar17 * dVar7 + dVar8) - (pIVar13->XAxis).Range.Min) * pIVar22->Mx +
                  (double)pIVar22->PixelRange[iVar10].Min.x);
  fVar33 = (float)((((double)(float)(dVar18 / pIVar22->LogDenY[iVar10]) *
                     (pIVar13->YAxis[iVar10].Range.Max - dVar9) + dVar9) - dVar9) *
                   pIVar22->My[iVar10] + (double)pIVar22->PixelRange[iVar10].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar29 = fVar3;
  if (fVar5 <= fVar3) {
    fVar29 = fVar5;
  }
  if (fVar26 <= fVar29) {
    fVar29 = fVar26;
  }
  if (fVar33 <= fVar29) {
    fVar29 = fVar33;
  }
  bVar23 = false;
  if ((fVar29 < (cull_rect->Max).y) &&
     (fVar29 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar25 = -(uint)(fVar26 <= fVar29),
     fVar29 = (float)(~uVar25 & (uint)fVar26 | uVar25 & (uint)fVar29),
     uVar25 = -(uint)(fVar33 <= fVar29),
     fVar29 = (float)(~uVar25 & (uint)fVar33 | uVar25 & (uint)fVar29), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar29 && fVar29 != *pfVar1)) {
    fVar29 = fVar2;
    if (fVar4 <= fVar2) {
      fVar29 = fVar4;
    }
    if (fVar27 <= fVar29) {
      fVar29 = fVar27;
    }
    if (fVar31 <= fVar29) {
      fVar29 = fVar31;
    }
    bVar23 = false;
    if (fVar29 < (cull_rect->Max).x) {
      fVar29 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar25 = -(uint)(fVar27 <= fVar29);
      fVar29 = (float)(~uVar25 & (uint)fVar27 | uVar25 & (uint)fVar29);
      uVar25 = -(uint)(fVar31 <= fVar29);
      fVar29 = (float)(~uVar25 & (uint)fVar31 | uVar25 & (uint)fVar29);
      bVar23 = (cull_rect->Min).x <= fVar29 && fVar29 != (cull_rect->Min).x;
    }
  }
  IVar28.y = fVar26;
  IVar28.x = fVar27;
  IVar30.y = fVar33;
  IVar30.x = fVar31;
  if (bVar23 != false) {
    fVar29 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar35 = fVar2 * fVar26 - fVar27 * fVar3;
    fVar34 = fVar4 * fVar33 - fVar31 * fVar5;
    fVar32 = (fVar2 - fVar27) * (fVar5 - fVar33) - (fVar4 - fVar31) * (fVar3 - fVar26);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = this->Col;
    pIVar15[1].pos = IVar28;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = this->Col;
    IVar19.y = ((fVar5 - fVar33) * fVar35 - (fVar3 - fVar26) * fVar34) / fVar32;
    IVar19.x = (fVar35 * (fVar4 - fVar31) - (fVar2 - fVar27) * fVar34) / fVar32;
    pIVar15[2].pos = IVar19;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = this->Col;
    pIVar15[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = this->Col;
    pIVar15[4].pos = IVar30;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar15 + 5;
    uVar25 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar24 = (ImDrawIdx)uVar25;
    *pIVar16 = IVar24;
    uVar20 = -(ushort)(fVar6 < fVar29 && fVar26 < fVar33 || fVar29 < fVar6 && fVar33 < fVar26) & 1;
    pIVar16[1] = IVar24 + uVar20 + 1;
    pIVar16[2] = IVar24 + 3;
    pIVar16[3] = IVar24 + 1;
    pIVar16[4] = (uVar20 ^ 3) + IVar24;
    pIVar16[5] = IVar24 + 4;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar25 + 5;
  }
  this->P11 = IVar28;
  this->P12 = IVar30;
  return bVar23;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }